

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.h
# Opt level: O0

void __thiscall TcpServer::add_new_tcp_conn(TcpServer *this,TcpConnSP *tcp_conn)

{
  int iVar1;
  element_type *this_00;
  shared_ptr<TcpConnection> local_30;
  int local_1c;
  __shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  int timer_id;
  TcpConnSP *tcp_conn_local;
  TcpServer *this_local;
  
  iVar1 = this->ts_tcp_conn_timout_ms;
  p_Stack_18 = (__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               tcp_conn;
  tcp_conn_local = (TcpConnSP *)this;
  std::shared_ptr<TcpConnection>::shared_ptr(&local_30,tcp_conn);
  iVar1 = Timer::
          run_after<TcpServer::add_new_tcp_conn(std::shared_ptr<TcpConnection>const&)::_lambda()_1_>
                    (&this->ts_timer,iVar1,false,(anon_class_16_1_33859248_for__M_f *)&local_30);
  add_new_tcp_conn(std::shared_ptr<TcpConnection>const&)::{lambda()#1}::~shared_ptr
            ((_lambda___1_ *)&local_30);
  local_1c = iVar1;
  this_00 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(p_Stack_18);
  TcpConnection::set_timer_id(this_00,local_1c);
  std::vector<std::shared_ptr<TcpConnection>,std::allocator<std::shared_ptr<TcpConnection>>>::
  emplace_back<std::shared_ptr<TcpConnection>const&>
            ((vector<std::shared_ptr<TcpConnection>,std::allocator<std::shared_ptr<TcpConnection>>>
              *)&this->ts_tcp_connections,(shared_ptr<TcpConnection> *)p_Stack_18);
  return;
}

Assistant:

void add_new_tcp_conn(const TcpConnSP& tcp_conn) { 
        auto timer_id = ts_timer.run_after(ts_tcp_conn_timout_ms, false, [tcp_conn]{
LOG_INFO("tcp conn timeout!\n");
                            tcp_conn->active_close();
                        });
        tcp_conn->set_timer_id(timer_id);
        ts_tcp_connections.emplace_back(tcp_conn); 
    }